

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

void __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::insert(SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
         *this,Lhs *val)

{
  SelectedSummand *this_00;
  SelectedSummand local_80;
  SelectedSummand local_50;
  
  Kernel::SelectedSummand::SelectedSummand(&local_80,&val->super_SelectedSummand);
  Kernel::SelectedSummand::SelectedSummand(&local_50,&local_80);
  this_00 = (SelectedSummand *)
            insertPositionRaw<Inferences::ALASCA::FourierMotzkinConf::Lhs>(this,(Lhs *)&local_50);
  Kernel::SelectedSummand::SelectedSummand(this_00,&val->super_SelectedSummand);
  return;
}

Assistant:

inline
  void insert(Value val)
  {
    void* pval = insertPositionRaw(val);
    ::new(pval) Value(std::move(val));
  }